

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfa.h
# Opt level: O2

vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_> *
spvtools::CFA<spvtools::val::BasicBlock>::TraversalRoots
          (vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
           *__return_storage_ptr__,
          vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_> *blocks,
          get_blocks_func *succ_func,get_blocks_func *pred_func)

{
  pointer ppBVar1;
  vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_> *pvVar2;
  size_type sVar3;
  pointer ppBVar4;
  anon_class_1_0_00000001 no_terminal_blocks;
  anon_class_1_0_00000001 ignore_block;
  BasicBlock *block;
  anon_class_8_1_9f2c660a mark_visited;
  unordered_set<const_spvtools::val::BasicBlock_*,_std::hash<const_spvtools::val::BasicBlock_*>,_std::equal_to<const_spvtools::val::BasicBlock_*>,_std::allocator<const_spvtools::val::BasicBlock_*>_>
  visited;
  anon_class_32_4_fc377077 traverse_from_root;
  anon_class_1_0_00000001 local_a2;
  anon_class_1_0_00000001 local_a1;
  BasicBlock *local_a0;
  vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_> *local_98;
  anon_class_8_1_9f2c660a local_90;
  _Hashtable<const_spvtools::val::BasicBlock_*,_const_spvtools::val::BasicBlock_*,_std::allocator<const_spvtools::val::BasicBlock_*>,_std::__detail::_Identity,_std::equal_to<const_spvtools::val::BasicBlock_*>,_std::hash<const_spvtools::val::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_88;
  anon_class_32_4_fc377077 local_50;
  
  local_88._M_buckets = &local_88._M_single_bucket;
  local_88._M_bucket_count = 1;
  local_88._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_88._M_element_count = 0;
  local_88._M_rehash_policy._M_max_load_factor = 1.0;
  local_88._M_rehash_policy._M_next_resize = 0;
  local_88._M_single_bucket = (__node_base_ptr)0x0;
  local_90.visited =
       (unordered_set<const_spvtools::val::BasicBlock_*,_std::hash<const_spvtools::val::BasicBlock_*>,_std::equal_to<const_spvtools::val::BasicBlock_*>,_std::allocator<const_spvtools::val::BasicBlock_*>_>
        *)&local_88;
  local_50.mark_visited = &local_90;
  local_50.ignore_block = &local_a1;
  local_50.no_terminal_blocks = &local_a2;
  (__return_storage_ptr__->
  super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ppBVar4 = (blocks->
            super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  ppBVar1 = (blocks->
            super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  local_98 = blocks;
  local_50.succ_func = succ_func;
  do {
    if (ppBVar4 == ppBVar1) {
      ppBVar1 = (local_98->
                super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                )._M_impl.super__Vector_impl_data._M_finish;
      for (ppBVar4 = (local_98->
                     super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                     )._M_impl.super__Vector_impl_data._M_start; ppBVar4 != ppBVar1;
          ppBVar4 = ppBVar4 + 1) {
        local_a0 = *ppBVar4;
        sVar3 = std::
                _Hashtable<const_spvtools::val::BasicBlock_*,_const_spvtools::val::BasicBlock_*,_std::allocator<const_spvtools::val::BasicBlock_*>,_std::__detail::_Identity,_std::equal_to<const_spvtools::val::BasicBlock_*>,_std::hash<const_spvtools::val::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                ::count(&local_88,&local_a0);
        if (sVar3 == 0) {
          std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>::
          push_back(__return_storage_ptr__,&local_a0);
          TraversalRoots::anon_class_32_4_fc377077::operator()(&local_50,local_a0);
        }
      }
      std::
      _Hashtable<const_spvtools::val::BasicBlock_*,_const_spvtools::val::BasicBlock_*,_std::allocator<const_spvtools::val::BasicBlock_*>,_std::__detail::_Identity,_std::equal_to<const_spvtools::val::BasicBlock_*>,_std::hash<const_spvtools::val::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::~_Hashtable(&local_88);
      return __return_storage_ptr__;
    }
    local_a0 = *ppBVar4;
    pvVar2 = std::
             function<const_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_*(const_spvtools::val::BasicBlock_*)>
             ::operator()(pred_func,local_a0);
    if ((pvVar2->
        super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
        )._M_impl.super__Vector_impl_data._M_start ==
        (pvVar2->
        super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
        )._M_impl.super__Vector_impl_data._M_finish) {
      sVar3 = std::
              _Hashtable<const_spvtools::val::BasicBlock_*,_const_spvtools::val::BasicBlock_*,_std::allocator<const_spvtools::val::BasicBlock_*>,_std::__detail::_Identity,_std::equal_to<const_spvtools::val::BasicBlock_*>,_std::hash<const_spvtools::val::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::count(&local_88,&local_a0);
      if (sVar3 != 0) {
        __assert_fail("visited.count(block) == 0 && \"Malformed graph!\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/cfa.h"
                      ,0x14c,
                      "static std::vector<BB *> spvtools::CFA<spvtools::val::BasicBlock>::TraversalRoots(const std::vector<BB *> &, get_blocks_func, get_blocks_func) [BB = spvtools::val::BasicBlock]"
                     );
      }
      std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>::
      push_back(__return_storage_ptr__,&local_a0);
      TraversalRoots::anon_class_32_4_fc377077::operator()(&local_50,local_a0);
    }
    ppBVar4 = ppBVar4 + 1;
  } while( true );
}

Assistant:

std::vector<BB*> CFA<BB>::TraversalRoots(const std::vector<BB*>& blocks,
                                         get_blocks_func succ_func,
                                         get_blocks_func pred_func) {
  // The set of nodes which have been visited from any of the roots so far.
  std::unordered_set<const BB*> visited;

  auto mark_visited = [&visited](const BB* b) { visited.insert(b); };
  auto ignore_block = [](const BB*) {};
  auto no_terminal_blocks = [](const BB*) { return false; };

  auto traverse_from_root = [&mark_visited, &succ_func, &ignore_block,
                             &no_terminal_blocks](const BB* entry) {
    DepthFirstTraversal(entry, succ_func, mark_visited, ignore_block,
                        no_terminal_blocks);
  };

  std::vector<BB*> result;

  // First collect nodes without predecessors.
  for (auto block : blocks) {
    if (pred_func(block)->empty()) {
      assert(visited.count(block) == 0 && "Malformed graph!");
      result.push_back(block);
      traverse_from_root(block);
    }
  }

  // Now collect other stranded nodes.  These must be in unreachable cycles.
  for (auto block : blocks) {
    if (visited.count(block) == 0) {
      result.push_back(block);
      traverse_from_root(block);
    }
  }

  return result;
}